

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O1

target_ulong helper_shra_r_w_mips64(target_ulong sa,target_ulong rt)

{
  long lVar1;
  
  if ((sa & 0x1f) == 0) {
    lVar1 = (rt & 0xffffffff) * 2;
  }
  else {
    lVar1 = (long)(int)rt >> (((byte)sa & 0x1f) - 1 & 0x3f);
  }
  return lVar1 * 0x80000000 + 0x80000000 >> 0x20;
}

Assistant:

static inline uint32_t mipsdsp_rnd32_rashift(uint32_t a, uint8_t s)
{
    int64_t temp;

    if (s == 0) {
        temp = (uint64_t)a << 1;
    } else {
        temp = (int64_t)(int32_t)a >> (s - 1);
    }
    temp += 1;

    return (temp >> 1) & 0xFFFFFFFFull;
}